

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O3

void __thiscall r_comp::Image::add_object(Image *this,Code *object)

{
  pointer ppSVar1;
  pointer ppSVar2;
  char cVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  SysObject *this_00;
  size_t sVar6;
  Code *pCVar7;
  long lVar8;
  uint *puVar9;
  Image *this_01;
  size_t sVar10;
  Code *local_38;
  
  local_38 = object;
  iVar4 = std::
          _Hashtable<r_code::Code_*,_std::pair<r_code::Code_*const,_unsigned_long>,_std::allocator<std::pair<r_code::Code_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<r_code::Code_*>,_std::hash<r_code::Code_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->ptrs_to_indices)._M_h,&local_38);
  if (iVar4.super__Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>._M_cur
      == (__node_type *)0x0) {
    ppSVar1 = (this->code_segment).objects.m_vector.
              super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppSVar2 = (this->code_segment).objects.m_vector.
              super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pmVar5 = std::__detail::
             _Map_base<r_code::Code_*,_std::pair<r_code::Code_*const,_unsigned_long>,_std::allocator<std::pair<r_code::Code_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<r_code::Code_*>,_std::hash<r_code::Code_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<r_code::Code_*,_std::pair<r_code::Code_*const,_unsigned_long>,_std::allocator<std::pair<r_code::Code_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<r_code::Code_*>,_std::hash<r_code::Code_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->ptrs_to_indices,&local_38);
    *pmVar5 = (long)ppSVar1 - (long)ppSVar2 >> 3;
    this_00 = (SysObject *)operator_new(0x70);
    r_code::SysObject::SysObject(this_00,local_38);
    this_01 = this;
    add_sys_object(this,this_00);
    sVar6 = get_reference_count(this_01,local_38);
    if (sVar6 != 0) {
      sVar10 = 0;
      do {
        pCVar7 = (Code *)(**(code **)(*(long *)local_38 + 0x48))();
        lVar8 = (**(code **)(*(long *)pCVar7 + 0x10))(pCVar7);
        if (lVar8 == 0xffffffff) {
LAB_0013c3a2:
          add_object(this,pCVar7);
        }
        else {
          cVar3 = (**(code **)(*(long *)pCVar7 + 0x70))(pCVar7);
          if (cVar3 != '\0') goto LAB_0013c3a2;
        }
        sVar10 = sVar10 + 1;
      } while (sVar6 != sVar10);
    }
    pCVar7 = local_38;
    puVar9 = r_code::vector<unsigned_int>::operator[]((vector<unsigned_int> *)(this_00 + 0x20),0);
    *puVar9 = (uint)pCVar7;
    puVar9 = r_code::vector<unsigned_int>::operator[]((vector<unsigned_int> *)(this_00 + 0x20),1);
    *puVar9 = (uint)((ulong)pCVar7 >> 0x20);
  }
  return;
}

Assistant:

void Image::add_object(Code *object)
{
    std::unordered_map<Code *, size_t>::iterator it = ptrs_to_indices.find(object);

    if (it != ptrs_to_indices.end()) { // object already there.
        return;
    }

    size_t object_index;
    ptrs_to_indices[object] = object_index = code_segment.objects.as_std()->size();
    SysObject *sys_object = new SysObject(object);
    add_sys_object(sys_object);
    size_t reference_count = get_reference_count(object);

    for (size_t i = 0; i < reference_count; ++i) { // follow reference pointers and recurse.
        Code *reference = object->get_reference(i);

        if (reference->get_oid() == UNDEFINED_OID ||
            reference->is_invalidated()) { // the referenced object is not in the image and will not be added otherwise.
            add_object(reference);
        }
    }

    uintptr_t _object = (uintptr_t)object;
    sys_object->references[0] = (_object & UINT32_MAX);
    sys_object->references[1] = (_object >> 32);
}